

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_tree.cpp
# Opt level: O3

int __thiscall b_tree::remove(b_tree *this,char *__filename)

{
  uint64_t ofs;
  uint64_t extraout_RAX;
  b_tree_node root;
  b_tree_node local_80;
  
  ofs = pager::root_ofs(&this->_p);
  if (ofs != 0) {
    b_tree_node::b_tree_node(&local_80,&this->_p,ofs);
    b_tree_node::_remove(&local_80,(int64_t)__filename);
    r_memory_map::~r_memory_map(&local_80._mm);
    ofs = extraout_RAX;
  }
  return (int)ofs;
}

Assistant:

void b_tree::remove(int64_t k)
{
    auto root_ofs = _p.root_ofs();
    if (root_ofs != 0)
    {
        b_tree_node root(_p, root_ofs);
        root._remove(k);
    }
}